

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fchown_cb(uv_fs_t *req)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  char *loop;
  uv_buf_t uVar4;
  uv_fs_t uStackY_3b0;
  uv_loop_t *puStackY_1f8;
  code *pcStackY_1f0;
  uv_loop_t *puStack_180;
  
  if (req->fs_type == UV_FS_FCHOWN) {
    if (req->result == 0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup(req);
      return;
    }
  }
  else {
    fchown_cb_cold_1();
  }
  fchown_cb_cold_2();
  if (req->fs_type == UV_FS_LCHOWN) {
    if (req->result == 0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup(req);
      return;
    }
  }
  else {
    lchown_cb_cold_1();
  }
  lchown_cb_cold_2();
  puVar3 = (uv_loop_t *)0x194385;
  pcStackY_1f0 = (code *)0x153205;
  unlink("test_file");
  pcStackY_1f0 = (code *)0x153211;
  unlink("test_file_link");
  pcStackY_1f0 = (code *)0x15321d;
  unlink("test_file_link2");
  pcStackY_1f0 = (code *)0x153222;
  ::loop = uv_default_loop();
  loop = (char *)0x0;
  pcStackY_1f0 = (code *)0x153246;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar2 = puStack_180;
  if (iVar1 < 0) {
    pcStackY_1f0 = (code *)0x153584;
    run_test_fs_link_cold_1();
LAB_00153584:
    pcStackY_1f0 = (code *)0x153589;
    run_test_fs_link_cold_2();
LAB_00153589:
    pcStackY_1f0 = (code *)0x15358e;
    run_test_fs_link_cold_3();
LAB_0015358e:
    pcStackY_1f0 = (code *)0x153593;
    run_test_fs_link_cold_4();
LAB_00153593:
    pcStackY_1f0 = (code *)0x153598;
    run_test_fs_link_cold_5();
LAB_00153598:
    pcStackY_1f0 = (code *)0x15359d;
    run_test_fs_link_cold_6();
LAB_0015359d:
    puVar2 = puVar3;
    pcStackY_1f0 = (code *)0x1535a2;
    run_test_fs_link_cold_7();
LAB_001535a2:
    pcStackY_1f0 = (code *)0x1535a7;
    run_test_fs_link_cold_8();
LAB_001535a7:
    pcStackY_1f0 = (code *)0x1535ac;
    run_test_fs_link_cold_9();
LAB_001535ac:
    pcStackY_1f0 = (code *)0x1535b1;
    run_test_fs_link_cold_10();
LAB_001535b1:
    pcStackY_1f0 = (code *)0x1535b6;
    run_test_fs_link_cold_11();
LAB_001535b6:
    pcStackY_1f0 = (code *)0x1535bb;
    run_test_fs_link_cold_12();
LAB_001535bb:
    pcStackY_1f0 = (code *)0x1535c0;
    run_test_fs_link_cold_13();
LAB_001535c0:
    puVar3 = puVar2;
    pcStackY_1f0 = (code *)0x1535c5;
    run_test_fs_link_cold_14();
LAB_001535c5:
    pcStackY_1f0 = (code *)0x1535ca;
    run_test_fs_link_cold_15();
LAB_001535ca:
    pcStackY_1f0 = (code *)0x1535cf;
    run_test_fs_link_cold_16();
LAB_001535cf:
    pcStackY_1f0 = (code *)0x1535d4;
    run_test_fs_link_cold_17();
LAB_001535d4:
    pcStackY_1f0 = (code *)0x1535d9;
    run_test_fs_link_cold_18();
  }
  else {
    puVar3 = puStack_180;
    if ((long)puStack_180 < 0) goto LAB_00153584;
    pcStackY_1f0 = (code *)0x153269;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    pcStackY_1f0 = (code *)0x15327a;
    iov = uv_buf_init(test_buf,0xd);
    loop = (char *)0x0;
    pcStackY_1f0 = (code *)0x1532b0;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,(uv_file)puVar2,&iov,1,
                        -1,(uv_fs_cb)0x0);
    puVar3 = puVar2;
    if (iVar1 != 0xd) goto LAB_00153589;
    if (puStack_180 != (uv_loop_t *)0xd) goto LAB_0015358e;
    pcStackY_1f0 = (code *)0x1532d2;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    pcStackY_1f0 = (code *)0x1532e5;
    uv_fs_close(::loop,(uv_fs_t *)&stack0xfffffffffffffe28,(uv_file)puVar2,(uv_fs_cb)0x0);
    loop = (char *)0x0;
    pcStackY_1f0 = (code *)0x153300;
    iVar1 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00153593;
    if (puStack_180 != (uv_loop_t *)0x0) goto LAB_00153598;
    pcStackY_1f0 = (code *)0x153321;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    loop = (char *)0x0;
    pcStackY_1f0 = (code *)0x15333d;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file_link",2,0,
                       (uv_fs_cb)0x0);
    puVar2 = puStack_180;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffe28;
    if (iVar1 < 0) goto LAB_0015359d;
    if ((long)puStack_180 < 0) goto LAB_001535a2;
    pcStackY_1f0 = (code *)0x153360;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_1f0 = (code *)0x153382;
    uVar4 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_1f0 = (code *)0x1533b4;
    iov = uVar4;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,(uv_file)puVar2,&iov,1,0
                       ,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_001535a7;
    if ((long)puStack_180 < 0) goto LAB_001535ac;
    loop = buf;
    pcStackY_1f0 = (code *)0x1533db;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_001535b1;
    pcStackY_1f0 = (code *)0x1533ea;
    close((uv_file)puVar2);
    pcStackY_1f0 = (code *)0x153410;
    loop = (char *)::loop;
    iVar1 = uv_fs_link(::loop,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file","test_file_link2",
                       link_cb);
    if (iVar1 != 0) goto LAB_001535b6;
    pcStackY_1f0 = (code *)0x153426;
    loop = (char *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_001535bb;
    loop = (char *)0x0;
    pcStackY_1f0 = (code *)0x153451;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file_link2",2,0,
                       (uv_fs_cb)0x0);
    puVar3 = puStack_180;
    if (iVar1 < 0) goto LAB_001535c0;
    if ((long)puStack_180 < 0) goto LAB_001535c5;
    pcStackY_1f0 = (code *)0x153474;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_1f0 = (code *)0x153496;
    uVar4 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_1f0 = (code *)0x1534c8;
    iov = uVar4;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,(uv_file)puVar3,&iov,1,0
                       ,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_001535ca;
    if ((long)puStack_180 < 0) goto LAB_001535cf;
    loop = buf;
    pcStackY_1f0 = (code *)0x1534ef;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_001535d4;
    pcStackY_1f0 = (code *)0x15350c;
    uv_fs_close(::loop,(uv_fs_t *)&stack0xfffffffffffffe28,(uv_file)puVar3,(uv_fs_cb)0x0);
    pcStackY_1f0 = (code *)0x15351a;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_1f0 = (code *)0x153526;
    unlink("test_file");
    pcStackY_1f0 = (code *)0x153532;
    unlink("test_file_link");
    pcStackY_1f0 = (code *)0x15353e;
    unlink("test_file_link2");
    pcStackY_1f0 = (code *)0x153543;
    puVar3 = uv_default_loop();
    pcStackY_1f0 = (code *)0x153557;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcStackY_1f0 = (code *)0x153561;
    uv_run(puVar3,UV_RUN_DEFAULT);
    pcStackY_1f0 = (code *)0x153566;
    loop = (char *)uv_default_loop();
    pcStackY_1f0 = (code *)0x15356e;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return;
    }
  }
  pcStackY_1f0 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)loop)->backend_fd == 0x17) {
    if (((uv_loop_t *)loop)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop);
      return;
    }
  }
  else {
    puStackY_1f8 = (uv_loop_t *)0x1535fd;
    link_cb_cold_1();
  }
  puStackY_1f8 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_1f8 = puVar3;
  ::loop = uv_default_loop();
  iVar1 = uv_fs_readlink(::loop,&uStackY_3b0,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001536f7;
    if (dummy_cb_count != 1) goto LAB_001536fc;
    if (uStackY_3b0.ptr != (void *)0x0) goto LAB_00153701;
    if (uStackY_3b0.result != -2) goto LAB_00153706;
    uv_fs_req_cleanup(&uStackY_3b0);
    iVar1 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_3b0,"no_such_file",(uv_fs_cb)0x0);
    if (iVar1 != -2) goto LAB_0015370b;
    if (uStackY_3b0.ptr != (void *)0x0) goto LAB_00153710;
    if (uStackY_3b0.result == -2) {
      uv_fs_req_cleanup(&uStackY_3b0);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015371a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_001536f7:
    run_test_fs_readlink_cold_2();
LAB_001536fc:
    run_test_fs_readlink_cold_3();
LAB_00153701:
    run_test_fs_readlink_cold_4();
LAB_00153706:
    run_test_fs_readlink_cold_5();
LAB_0015370b:
    run_test_fs_readlink_cold_6();
LAB_00153710:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015371a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void fchown_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_FCHOWN);
  ASSERT(req->result == 0);
  fchown_cb_count++;
  uv_fs_req_cleanup(req);
}